

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void __thiscall DLightFlash::DLightFlash(DLightFlash *this,sector_t *sector,int min,int max)

{
  int iVar1;
  uint uVar2;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  if (0x7ffe < max) {
    max = 0x7fff;
  }
  if (max < -0x7fff) {
    max = -0x8000;
  }
  iVar1 = 0x7fff;
  if (min < 0x7fff) {
    iVar1 = min;
  }
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_007cb880;
  if (iVar1 < -0x7fff) {
    iVar1 = -0x8000;
  }
  this->m_MaxLight = max;
  this->m_MinLight = iVar1;
  this->m_MaxTime = 0x40;
  this->m_MinTime = 7;
  uVar2 = FRandom::operator()(&pr_lightflash);
  this->m_Count = (uVar2 & this->m_MaxTime) + 1;
  return;
}

Assistant:

DLightFlash::DLightFlash (sector_t *sector, int min, int max)
	: DLighting (sector)
{
	// Use specified light levels.
	m_MaxLight = sector_t::ClampLight(max);
	m_MinLight = sector_t::ClampLight(min);
	m_MaxTime = 64;
	m_MinTime = 7;
	m_Count = (pr_lightflash() & m_MaxTime) + 1;
}